

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * __thiscall pbrt::DiffuseAreaLight::Bounds(DiffuseAreaLight *this)

{
  WrapMode2D wrapMode;
  undefined8 uVar1;
  bool bVar2;
  Point2i PVar3;
  Tuple2<pbrt::Point2,_int> p;
  WrapMode w;
  LightBounds *in_RSI;
  LightBounds *in_RDI;
  DirectionCone nb;
  int c;
  int x;
  int y;
  Float phi;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 twoSided;
  Float in_stack_ffffffffffffff64;
  Float in_stack_ffffffffffffff68;
  Float in_stack_ffffffffffffff6c;
  LightBounds *b;
  int local_40;
  Image *in_stack_ffffffffffffffc8;
  WrapMode in_stack_ffffffffffffffd4;
  Float FVar4;
  Float local_1c;
  int iStack_14;
  Float local_10;
  
  uVar1 = _local_40;
  b = in_RDI;
  bVar2 = Image::operator_cast_to_bool((Image *)&in_RSI[3].theta_e);
  if (bVar2) {
    local_10 = 0.0;
    while( true ) {
      in_stack_ffffffffffffff6c = local_10;
      PVar3 = Image::Resolution((Image *)&in_RSI[3].theta_e);
      iStack_14 = PVar3.super_Tuple2<pbrt::Point2,_int>.y;
      if (iStack_14 <= (int)in_stack_ffffffffffffff6c) break;
      local_1c = 0.0;
      while (in_stack_ffffffffffffff68 = local_1c,
            p = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)&in_RSI[3].theta_e),
            (int)in_stack_ffffffffffffff68 < p.x) {
        for (FVar4 = 0.0; (int)FVar4 < 3; FVar4 = (Float)((int)FVar4 + Black)) {
          w = (WrapMode)((ulong)&in_RSI[3].theta_e >> 0x20);
          in_stack_ffffffffffffff64 = FVar4;
          Point2<int>::Point2((Point2<int> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                              (int)in_stack_ffffffffffffff48);
          FVar4 = in_stack_ffffffffffffff64;
          WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),w);
          wrapMode.wrap.values[1] = (WrapMode)FVar4;
          wrapMode.wrap.values[0] = in_stack_ffffffffffffffd4;
          Image::GetChannel(in_stack_ffffffffffffffc8,(Point2i)p,(int)((ulong)uVar1 >> 0x20),
                            wrapMode);
        }
        local_1c = (Float)((int)local_1c + 1);
      }
      local_10 = (Float)((int)local_10 + 1);
    }
    PVar3 = Image::Resolution((Image *)&in_RSI[3].theta_e);
    twoSided = (undefined1)((uint)in_stack_ffffffffffffff60 >> 0x18);
    local_40 = PVar3.super_Tuple2<pbrt::Point2,_int>.x;
    in_stack_ffffffffffffff54 = local_40 * 3;
    Image::Resolution((Image *)&in_RSI[3].theta_e);
  }
  else {
    DenselySampledSpectrum::MaxValue
              ((DenselySampledSpectrum *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    twoSided = (undefined1)((uint)in_stack_ffffffffffffff60 >> 0x18);
  }
  ShapeHandle::NormalBounds
            ((ShapeHandle *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ShapeHandle::Bounds((ShapeHandle *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  SafeACos(0.0);
  LightBounds::LightBounds
            (in_RSI,&b->b,(Vector3f *)in_RDI,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff64,(bool)twoSided);
  return b;
}

Assistant:

LightBounds DiffuseAreaLight::Bounds() const {
    Float phi = 0;
    if (image) {
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;
    } else
        phi = Lemit.MaxValue();

    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    // TODO: for animated shapes, we probably need to worry about
    // renderFromLight as in SampleLi().
    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, SafeACos(nb.cosTheta), Pi / 2,
                       twoSided);
}